

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O1

void __thiscall
hanabi_learning_env::HanabiState::HanabiState
          (HanabiState *this,HanabiGame *parent_game,int start_player)

{
  int iVar1;
  allocator_type local_2e;
  allocator_type local_2d;
  value_type_conflict local_2c;
  
  this->parent_game_ = parent_game;
  HanabiDeck::HanabiDeck(&this->deck_,parent_game);
  (this->discard_pile_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->discard_pile_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->discard_pile_).
  super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  vector(&this->hands_,(long)parent_game->num_players_,&local_2d);
  (this->move_history_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->move_history_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->move_history_).
  super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cur_player_ = -1;
  if ((start_player < 0) || (parent_game->num_players_ <= start_player)) {
    start_player = HanabiGame::GetSampledStartPlayer(parent_game);
  }
  this->next_non_chance_player_ = start_player;
  iVar1 = parent_game->max_life_tokens_;
  this->information_tokens_ = parent_game->max_information_tokens_;
  this->life_tokens_ = iVar1;
  local_2c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->fireworks_,(long)parent_game->num_colors_,&local_2c,&local_2e);
  this->turns_to_play_ = parent_game->num_players_;
  return;
}

Assistant:

HanabiState::HanabiState(const HanabiGame* parent_game, int start_player)
    : parent_game_(parent_game),
      deck_(*parent_game),
      hands_(parent_game->NumPlayers()),
      cur_player_(kChancePlayerId),
      next_non_chance_player_(start_player >= 0 &&
                                      start_player < parent_game->NumPlayers()
                                  ? start_player
                                  : parent_game->GetSampledStartPlayer()),
      information_tokens_(parent_game->MaxInformationTokens()),
      life_tokens_(parent_game->MaxLifeTokens()),
      fireworks_(parent_game->NumColors(), 0),
      turns_to_play_(parent_game->NumPlayers()) {}